

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void __thiscall CVmBigNumCache::~CVmBigNumCache(CVmBigNumCache *this)

{
  CVmBigNumCacheReg *in_RDI;
  size_t i;
  CVmBigNumCacheReg *p;
  char *local_18;
  
  for (local_18 = in_RDI[7].buf_; local_18 != (char *)0x0; local_18 = local_18 + -1) {
    CVmBigNumCacheReg::free_mem(in_RDI);
  }
  free(in_RDI->buf_);
  CVmBigNumCacheReg::free_mem(in_RDI);
  CVmBigNumCacheReg::free_mem(in_RDI);
  CVmBigNumCacheReg::free_mem(in_RDI);
  CVmBigNumCacheReg::free_mem(in_RDI);
  CVmBigNumCacheReg::free_mem(in_RDI);
  CVmBigNumCacheReg::free_mem(in_RDI);
  return;
}

Assistant:

CVmBigNumCache::~CVmBigNumCache()
{
    CVmBigNumCacheReg *p;
    size_t i;

    /* delete each of our allocated registers */
    for (p = reg_, i = max_regs_ ; i != 0 ; ++p, --i)
        p->free_mem();

    /* free the register list array */
    t3free(reg_);

    /* free the constant value registers */
    ln10_.free_mem();
    ln2_.free_mem();
    pi_.free_mem();
    e_.free_mem();
    dbl_max_.free_mem();
    dbl_min_.free_mem();
}